

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearboxAngled.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsGearboxAngled::ArchiveIN(ChShaftsGearboxAngled *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsGearboxAngled>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_50 = &this->t0;
  local_58 = "t0";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_38 = &this->shaft_dir1;
  local_58 = "shaft_dir1";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->shaft_dir2;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "shaft_dir2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChShaftsGearboxAngled::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsGearboxAngled>();

    // deserialize parent class:
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(t0);
    marchive >> CHNVP(shaft_dir1);
    marchive >> CHNVP(shaft_dir2);
    // marchive >> CHNVP(shaft1); //***TODO*** serialize with shared ptr
    // marchive >> CHNVP(shaft2); //***TODO*** serialize with shared ptr
    // marchive >> CHNVP(body); //***TODO*** serialize with shared ptr
}